

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase241::run(TestCase241 *this)

{
  bool bVar1;
  bool local_569;
  undefined1 auStack_568 [7];
  bool _kj_shouldLog_4;
  Maybe<capnp::StructSchema::Field> local_558;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_510;
  undefined1 local_4c8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_4;
  undefined1 auStack_458 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_448;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_400;
  undefined1 local_3b8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_3;
  undefined1 auStack_348 [7];
  bool _kj_shouldLog_2;
  Maybe<capnp::StructSchema::Field> local_338;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_2f0;
  undefined1 local_2a8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_2;
  undefined1 auStack_238 [7];
  bool _kj_shouldLog_1;
  Maybe<capnp::StructSchema::Field> local_228;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1e0;
  undefined1 local_198 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_1;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_120;
  Maybe<capnp::StructSchema::Field> local_110;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_c8;
  undefined1 local_80 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition;
  StructSchema schema;
  TestCase241 *this_local;
  
  _kjCondition._96_8_ = Schema::from<capnproto_test::capnp::test::TestUnnamedUnion>();
  kj::StringPtr::StringPtr((StringPtr *)&local_120,"");
  StructSchema::findFieldByName
            (&local_110,(StructSchema *)&_kjCondition.result,(StringPtr)local_120);
  kj::_::DebugExpressionStart::operator<<
            (&local_c8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_110);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_80,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_c8,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_c8);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_110);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar1) {
    _kjCondition_1._99_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._99_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"\\\") == kj::none\", _kjCondition"
                 ,(char (*) [56])"failed: expected schema.findFieldByName(\"\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_80);
      _kjCondition_1._99_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_80);
  kj::StringPtr::StringPtr((StringPtr *)auStack_238,"foo");
  StructSchema::findFieldByName
            (&local_228,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_238);
  kj::_::DebugExpressionStart::operator<<
            (&local_1e0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_228);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_198,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1e0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1e0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_228);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  if (!bVar1) {
    _kjCondition_2._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"foo\\\") != kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected schema.findFieldByName(\"foo\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_198);
      _kjCondition_2._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_198);
  kj::StringPtr::StringPtr((StringPtr *)auStack_348,"bar");
  StructSchema::findFieldByName
            (&local_338,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_348);
  kj::_::DebugExpressionStart::operator<<
            (&local_2f0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_338);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_2a8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_2f0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_2f0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_338);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
  if (!bVar1) {
    _kjCondition_3._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xf7,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"bar\\\") != kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected schema.findFieldByName(\"bar\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_2a8);
      _kjCondition_3._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_2a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_458,"before");
  StructSchema::findFieldByName
            (&local_448,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_458);
  kj::_::DebugExpressionStart::operator<<
            (&local_400,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_448);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_3b8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_400,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_400);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_448);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b8);
  if (!bVar1) {
    _kjCondition_4._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"before\\\") != kj::none\", _kjCondition"
                 ,(char (*) [62])"failed: expected schema.findFieldByName(\"before\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_3b8);
      _kjCondition_4._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_3b8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_568,"after");
  StructSchema::findFieldByName
            (&local_558,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_568);
  kj::_::DebugExpressionStart::operator<<
            (&local_510,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_558);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_4c8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_510,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_510);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_558);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4c8);
  if (!bVar1) {
    local_569 = kj::_::Debug::shouldLog(ERROR);
    while (local_569 != false) {
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xf9,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"after\\\") != kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected schema.findFieldByName(\"after\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_4c8);
      local_569 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_4c8);
  return;
}

Assistant:

TEST(Schema, UnnamedUnion) {
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();

  EXPECT_TRUE(schema.findFieldByName("") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("foo") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("bar") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("before") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("after") != kj::none);
}